

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# integrators.cpp
# Opt level: O1

Float pbrt::funcs::rotatedCheckerboard(Point2f p)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 in_register_00001208 [56];
  undefined1 auVar5 [64];
  undefined1 auVar6 [16];
  
  auVar5._8_56_ = in_register_00001208;
  auVar5._0_8_ = p.super_Tuple2<pbrt::Point2,_float>;
  auVar2 = vmovshdup_avx(auVar5._0_16_);
  auVar6._0_4_ = auVar2._0_4_ * -0.70710677;
  auVar6._4_4_ = auVar2._4_4_ * 0.70710677;
  auVar6._8_4_ = auVar2._8_4_ * 0.0;
  auVar6._12_4_ = auVar2._12_4_ * 0.0;
  auVar3._0_4_ = p.super_Tuple2<pbrt::Point2,_float>.x;
  auVar3._4_4_ = auVar3._0_4_;
  auVar3._8_4_ = auVar3._0_4_;
  auVar3._12_4_ = auVar3._0_4_;
  auVar2._8_4_ = 0x3f3504f3;
  auVar2._0_8_ = 0x3f3504f33f3504f3;
  auVar2._12_4_ = 0x3f3504f3;
  auVar2 = vfmadd132ps_avx512vl(auVar3,auVar6,auVar2);
  auVar1._8_4_ = 0x41200000;
  auVar1._0_8_ = 0x4120000041200000;
  auVar1._12_4_ = 0x41200000;
  auVar2 = vmulps_avx512vl(auVar2,auVar1);
  auVar4._0_4_ = (uint)auVar2._0_4_;
  auVar4._4_4_ = (int)auVar2._4_4_;
  auVar4._8_4_ = (int)auVar2._8_4_;
  auVar4._12_4_ = (int)auVar2._12_4_;
  auVar2 = vpshufd_avx(auVar4,0x55);
  return (float)((auVar2._0_4_ ^ auVar4._0_4_) * 2 & 2) / 1.0169845;
}

Assistant:

static Float rotatedCheckerboard(Point2f p) {
    Float angle = Radians(45);
    Float nrm = 1.0169844966464572;
    return checkerboard({p.x * std::cos(angle) - p.y * std::sin(angle),
                         p.x * std::sin(angle) + p.y * std::cos(angle)}) /
           nrm;
}